

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormat::adoptCurrencyPluralInfo(DecimalFormat *this,CurrencyPluralInfo *toAdopt)

{
  DecimalFormatProperties *pDVar1;
  CurrencyPluralInfo *toAdopt_local;
  DecimalFormat *this_local;
  
  pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  LocalPointer<icu_63::CurrencyPluralInfo>::adoptInstead(&(pDVar1->currencyPluralInfo).fPtr,toAdopt)
  ;
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::adoptCurrencyPluralInfo(CurrencyPluralInfo* toAdopt) {
    fields->properties->currencyPluralInfo.fPtr.adoptInstead(toAdopt);
    touchNoError();
}